

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStreambuf.hh
# Opt level: O3

pos_type __thiscall
avro::istreambuf::seekoff(istreambuf *this,off_type off,seekdir dir,openmode param_3)

{
  element_type *peVar1;
  _Elt_pointer pCVar2;
  _Map_pointer ppCVar3;
  _Elt_pointer pCVar4;
  _Elt_pointer pCVar5;
  ulong uVar6;
  data_type *pdVar7;
  long lVar8;
  data_type *pdVar9;
  long lVar10;
  pos_type pVar11;
  
  lVar10 = this->basePos_;
  pdVar7 = *(data_type **)&this->field_0x8;
  uVar6 = (*(long *)&this->field_0x10 - (long)pdVar7) + lVar10;
  if (dir == _S_end) {
    off = off + ((this->buffer_).pimpl_.px)->size_;
  }
  else if (dir == _S_cur) {
    off = off + uVar6;
  }
  if ((off != uVar6) &&
     ((lVar8 = (*(long *)&this->field_0x18 - (long)pdVar7) + lVar10, off <= lVar8 ||
      (uVar6 = 0xffffffffffffffff, off <= (long)((this->buffer_).pimpl_.px)->size_)))) {
    if (off < lVar10) {
      peVar1 = (this->buffer_).pimpl_.px;
      pCVar2 = (peVar1->readChunks_).
               super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      ppCVar3 = *(_Map_pointer *)
                 ((long)&(peVar1->readChunks_).
                         super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                         ._M_impl.super__Deque_impl_data._M_start + 0x18);
      pCVar4 = *(_Elt_pointer *)
                ((long)&(peVar1->readChunks_).
                        super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                        ._M_impl.super__Deque_impl_data._M_start + 8);
      pCVar5 = *(_Elt_pointer *)
                ((long)&(peVar1->readChunks_).
                        super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                        ._M_impl.super__Deque_impl_data._M_start + 0x10);
      (this->iter_).helper_.iter_._M_cur = pCVar2;
      (this->iter_).helper_.iter_._M_first = pCVar4;
      (this->iter_).helper_.iter_._M_last = pCVar5;
      (this->iter_).helper_.iter_._M_node = ppCVar3;
      this->basePos_ = 0;
      if (pCVar2 == (peVar1->readChunks_).
                    super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_cur) {
        *(undefined8 *)&this->field_0x8 = 0;
        *(undefined8 *)&this->field_0x10 = 0;
        *(undefined8 *)&this->field_0x18 = 0;
        pdVar7 = (data_type *)0x0;
        pdVar9 = (data_type *)0x0;
      }
      else {
        pdVar7 = pCVar2->readPos_;
        pdVar9 = pCVar2->writePos_;
        *(data_type **)&this->field_0x8 = pdVar7;
        *(data_type **)&this->field_0x10 = pdVar7;
        *(data_type **)&this->field_0x18 = pdVar9;
      }
      lVar8 = (long)pdVar9 - (long)pdVar7;
      lVar10 = 0;
    }
    while (lVar8 < off) {
      underflow(this);
      pdVar7 = *(data_type **)&this->field_0x8;
      lVar10 = this->basePos_;
      lVar8 = (*(long *)&this->field_0x18 + lVar10) - (long)pdVar7;
    }
    *(data_type **)&this->field_0x10 = pdVar7 + (off - lVar10);
    uVar6 = off;
  }
  pVar11._M_state.__count = 0;
  pVar11._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  pVar11._M_off = uVar6;
  return pVar11;
}

Assistant:

virtual pos_type seekoff(off_type off, std::ios::seekdir dir, std::ios_base::openmode) {

        off_type curpos = basePos_ + (gptr() - eback()); 
        off_type newpos = off;

        if(dir == std::ios::cur) {
            newpos += curpos;
        }
        else if (dir == std::ios::end) {
            newpos += buffer_.size();
        }
        // short circuit for tell()  
        if(newpos == curpos) {
            return curpos;
        }

        off_type endpos = basePos_ + (egptr() - eback());

        // if the position is after our current buffer make
        // sure it's not past the end of the buffer
        if((newpos > endpos) && (newpos > static_cast<off_type>(buffer_.size()) )) {
            return pos_type(-1);
        }
        // if the new position is before our current iterator
        // reset the iterator to the beginning
        else if (newpos < basePos_) {
            iter_ = buffer_.begin();
            basePos_ = 0;
            setBuffer();
            endpos = (egptr() -eback());
        }

        // now if the new position is after the end of the buffer
        // increase the buffer until it is not
        while (newpos > endpos) {
            istreambuf::underflow();
            endpos = basePos_ + (egptr() - eback()); 
        }

        setg(eback(), eback() + (newpos - basePos_), egptr());
        return newpos;
    }